

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::internal::FormatCxxExceptionMessage_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *description,char *location)

{
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RAX;
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  Message message;
  Message local_28;
  
  local_28.ss_.ptr_ =
       (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )in_RAX.ptr_;
  Message::Message(&local_28);
  poVar4 = (ostream *)((long)local_28.ss_.ptr_ + 0x10);
  if (this == (internal *)0x0) {
    lVar2 = 0x15;
    pcVar3 = "Unknown C++ exception";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"C++ exception with description \"",0x20);
    sVar1 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)this,sVar1);
    lVar2 = 1;
    pcVar3 = "\"";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar2);
  poVar4 = (ostream *)((long)local_28.ss_.ptr_ + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," thrown in ",0xb);
  if (description == (char *)0x0) {
    sVar1 = 6;
    description = "(null)";
  }
  else {
    sVar1 = strlen(description);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,description,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
  StringStreamToString(__return_storage_ptr__,(stringstream *)local_28.ss_.ptr_);
  if (local_28.ss_.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_28.ss_.ptr_ + 8))(local_28.ss_.ptr_);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FormatCxxExceptionMessage(const char* description,
                                             const char* location) {
  Message message;
  if (description != NULL) {
    message << "C++ exception with description \"" << description << "\"";
  } else {
    message << "Unknown C++ exception";
  }
  message << " thrown in " << location << ".";

  return message.GetString();
}